

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

int __thiscall Fl_Window::handle(Fl_Window *this,int ev)

{
  Display *pDVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Fl_Group *pFVar5;
  Window WVar6;
  Fl_Group *local_20;
  Fl_Widget *p;
  int ev_local;
  Fl_Window *this_local;
  
  pFVar5 = Fl_Widget::parent((Fl_Widget *)this);
  if (pFVar5 != (Fl_Group *)0x0) {
    if (ev == 0xf) {
      iVar3 = shown(this);
      if (iVar3 != 0) {
        uVar4 = Fl_Widget::visible((Fl_Widget *)this);
        if (uVar4 != 0) {
          local_20 = Fl_Widget::parent((Fl_Widget *)this);
          while (uVar4 = Fl_Widget::visible(&local_20->super_Fl_Widget), uVar4 != 0) {
            local_20 = Fl_Widget::parent(&local_20->super_Fl_Widget);
          }
          bVar2 = Fl_Widget::type(&local_20->super_Fl_Widget);
          if (0xef < bVar2) goto LAB_001d0919;
        }
        pDVar1 = fl_display;
        WVar6 = fl_xid(this);
        XUnmapWindow(pDVar1,WVar6);
      }
    }
    else if (ev == 0x10) {
      iVar3 = shown(this);
      pDVar1 = fl_display;
      if (iVar3 == 0) {
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
      }
      else {
        WVar6 = fl_xid(this);
        XMapWindow(pDVar1,WVar6);
      }
    }
  }
LAB_001d0919:
  iVar3 = Fl_Group::handle(&this->super_Fl_Group,ev);
  return iVar3;
}

Assistant:

int Fl_Window::handle(int ev)
{
  if (parent()) {
    switch (ev) {
    case FL_SHOW:
      if (!shown()) show();
      else {
#if defined(USE_X11) || defined(WIN32)
        XMapWindow(fl_display, fl_xid(this)); // extra map calls are harmless
#elif defined(__APPLE_QUARTZ__)
	i->map();
#else
# error unsupported platform
#endif // __APPLE__
      }
      break;
    case FL_HIDE:
      if (shown()) {
	// Find what really turned invisible, if it was a parent window
	// we do nothing.  We need to avoid unnecessary unmap calls
	// because they cause the display to blink when the parent is
	// remapped.  However if this or any intermediate non-window
	// widget has really had hide() called directly on it, we must
	// unmap because when the parent window is remapped we don't
	// want to reappear.
	if (visible()) {
	 Fl_Widget* p = parent(); for (;p->visible();p = p->parent()) {}
	 if (p->type() >= FL_WINDOW) break; // don't do the unmap
	}
#if defined(USE_X11) || defined(WIN32)
	XUnmapWindow(fl_display, fl_xid(this));
#elif defined(__APPLE_QUARTZ__)
	i->unmap();
#else
# error platform unsupported
#endif
      }
      break;
    }
//  } else if (ev == FL_FOCUS || ev == FL_UNFOCUS) {
//    Fl_Tooltip::exit(Fl_Tooltip::current());
  }

  return Fl_Group::handle(ev);
}